

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_line.cpp
# Opt level: O2

void arrow_line_draw_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Am_Value *pAVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Am_Style ls;
  
  pAVar9 = Am_Object::Get(self,0x8b,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(self,0x8c,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(self,0x8d,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar9);
  uVar4 = iVar3 + x_offset;
  pAVar9 = Am_Object::Get(self,0x8e,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar9);
  uVar6 = y_offset + iVar5;
  pAVar9 = Am_Object::Get(self,0x91,0);
  iVar7 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(self,0x90,0);
  iVar8 = Am_Value::operator_cast_to_int(pAVar9);
  iVar3 = iVar3 - iVar1;
  iVar5 = iVar5 - iVar2;
  dVar11 = SQRT((double)(iVar5 * iVar5 + iVar3 * iVar3));
  dVar13 = 1.0;
  if (1.0 <= dVar11) {
    dVar13 = dVar11;
  }
  iVar10 = 1;
  if (1.0 <= dVar11) {
    iVar10 = iVar3;
  }
  dVar11 = (double)(iVar10 * iVar7) / dVar13;
  dVar12 = (double)(iVar5 * iVar7) / dVar13;
  pAVar9 = Am_Object::Get(self,0x6b,0);
  Am_Style::Am_Style(&ls,pAVar9);
  dVar14 = (double)(int)uVar4 - (double)(iVar10 * iVar8) / dVar13;
  dVar13 = (double)(int)uVar6 - (double)(iVar8 * iVar5) / dVar13;
  (*drawonable->_vptr_Am_Drawonable[0x28])
            (drawonable,&ls,(ulong)(uint)(int)(dVar12 + dVar14 + 0.5),
             (ulong)(uint)(int)((dVar13 - dVar11) + 0.5),(ulong)uVar4,(ulong)uVar6,0);
  (*drawonable->_vptr_Am_Drawonable[0x28])
            (drawonable,&ls,(ulong)(uint)(iVar1 + x_offset),(ulong)(uint)(iVar2 + y_offset),
             (ulong)uVar4,(ulong)uVar6,0);
  (*drawonable->_vptr_Am_Drawonable[0x28])
            (drawonable,&ls,(ulong)(uint)(int)((dVar14 - dVar12) + 0.5),
             (ulong)(uint)(int)(dVar13 + dVar11 + 0.5),(ulong)uVar4,(ulong)uVar6,0);
  Am_Style::~Am_Style(&ls);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, arrow_line_draw,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int x1 = (int)self.Get(Am_X1) + x_offset;
  int y1 = (int)self.Get(Am_Y1) + y_offset;
  int x2 = (int)self.Get(Am_X2) + x_offset;
  int y2 = (int)self.Get(Am_Y2) + y_offset;
  int head_width = self.Get(Am_HEAD_WIDTH);
  int head_length = self.Get(Am_HEAD_LENGTH);
  int dx = x2 - x1;
  int dy = y2 - y1;
  double d = sqrt((double)(dx * dx + dy * dy));
  if (d < 1.0) {
    d = 1.0;
    dx = 1;
  }
  double lx = (head_length * dx) / d;
  double ly = (head_length * dy) / d;
  double wx = (head_width * dx) / d;
  double wy = (head_width * dy) / d;
  Am_Style ls = self.Get(Am_LINE_STYLE);
  //
  //
  // WARNING!!	egcs 2.90.29 will hit an internal error if you swap the
  //			ordering of the first two calls.
  //
  drawonable->Draw_Line(ls, (int)(x2 - lx + wy + 0.5),
                        (int)(y2 - ly - wx + 0.5), x2, y2);
  drawonable->Draw_Line(ls, x1, y1, x2, y2);
  drawonable->Draw_Line(ls, (int)(x2 - lx - wy + 0.5),
                        (int)(y2 - ly + wx + 0.5), x2, y2);
}